

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

size_t __thiscall Memory::Recycler::FindRoots(Recycler *this)

{
  code *pcVar1;
  undefined1 this_00 [8];
  GuestArenaAllocator *this_01;
  bool bVar2;
  ConfigFlagsTable *pCVar3;
  undefined4 *puVar4;
  DListNodeBase<Memory::Recycler::GuestArenaAllocator> *node;
  DListNodeBase<Memory::ArenaData_*> *node_00;
  ArenaData **ppAVar5;
  size_t sVar6;
  ArenaData *local_88;
  undefined1 local_68 [8];
  Iterator externalGuestArenaIter;
  GuestArenaAllocator *allocator;
  EditingIterator guestArenaIter;
  size_t lastMarkCount;
  size_t scanRootBytes;
  Recycler *this_local;
  
  guestArenaIter.super_Iterator.current = (NodeBase *)(this->collectionStats).markData.markCount;
  if ((this->externalRootMarker != (ExternalRootMarker)0x0) &&
     ((this->inPartialCollectMode & 1U) == 0)) {
    pCVar3 = GetRecyclerFlagsTable(this);
    bVar2 = Js::Phases::IsEnabled(&pCVar3->Trace,MarkPhase);
    if (bVar2) {
LAB_0099b2ad:
      this->forceTraceMark = true;
      Output::Print(L"Scanning External Roots: ");
    }
    else {
      pCVar3 = GetRecyclerFlagsTable(this);
      bVar2 = Js::Phases::IsEnabled(&pCVar3->Trace,FindRootPhase);
      if (bVar2) goto LAB_0099b2ad;
    }
    if (this->objectGraphDumper != (RecyclerObjectGraphDumper *)0x0) {
      RecyclerObjectGraphDumper::BeginDumpObject(this->objectGraphDumper,L"External Roots");
    }
    (*this->externalRootMarker)(this->externalRootMarkerContext);
    if (this->objectGraphDumper != (RecyclerObjectGraphDumper *)0x0) {
      RecyclerObjectGraphDumper::EndDumpObject(this->objectGraphDumper);
    }
    pCVar3 = GetRecyclerFlagsTable(this);
    bVar2 = Js::Phases::IsEnabled(&pCVar3->Trace,MarkPhase);
    if (!bVar2) {
      pCVar3 = GetRecyclerFlagsTable(this);
      bVar2 = Js::Phases::IsEnabled(&pCVar3->Trace,FindRootPhase);
      if (!bVar2) goto LAB_0099b383;
    }
    this->forceTraceMark = false;
    Output::Print(L"\n");
    Output::Flush();
  }
LAB_0099b383:
  pCVar3 = GetRecyclerFlagsTable(this);
  bVar2 = Js::Phases::IsEnabled(&pCVar3->Trace,MarkPhase);
  if (bVar2) {
LAB_0099b3c7:
    this->forceTraceMark = true;
    Output::Print(L"Scanning Pinned Objects: ");
  }
  else {
    pCVar3 = GetRecyclerFlagsTable(this);
    bVar2 = Js::Phases::IsEnabled(&pCVar3->Trace,FindRootPhase);
    if (bVar2) goto LAB_0099b3c7;
  }
  lastMarkCount = ScanPinnedObjects<false>(this);
  pCVar3 = GetRecyclerFlagsTable(this);
  bVar2 = Js::Phases::IsEnabled(&pCVar3->Trace,MarkPhase);
  if (!bVar2) {
    pCVar3 = GetRecyclerFlagsTable(this);
    bVar2 = Js::Phases::IsEnabled(&pCVar3->Trace,FindRootPhase);
    if (!bVar2) goto LAB_0099b453;
  }
  this->forceTraceMark = false;
  Output::Print(L"\n");
  Output::Flush();
LAB_0099b453:
  if ((this->hasPendingConcurrentFindRoot & 1U) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x76f,"(!this->hasPendingConcurrentFindRoot)",
                       "!this->hasPendingConcurrentFindRoot");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::EditingIterator::EditingIterator
            ((EditingIterator *)&allocator,&this->guestArenaList);
  while( true ) {
    if (guestArenaIter.super_Iterator.list ==
        (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    this_01 = allocator;
    node = DListNodeBase<Memory::Recycler::GuestArenaAllocator>::Next
                     (&(guestArenaIter.super_Iterator.list)->
                       super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>);
    bVar2 = DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::IsHead
                      ((DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)this_01,node);
    if (bVar2) break;
    guestArenaIter.super_Iterator.list =
         (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)
         DListNodeBase<Memory::Recycler::GuestArenaAllocator>::Next
                   (&(guestArenaIter.super_Iterator.list)->
                     super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>);
    externalGuestArenaIter.current =
         (NodeBase *)
         DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::Iterator::Data
                   ((Iterator *)&allocator);
    if ((((GuestArenaAllocator *)externalGuestArenaIter.current)->pendingDelete & 1U) == 0) {
      if (this->backgroundFinishMarkCount == '\0') {
        local_88 = (ArenaData *)0x0;
        if ((GuestArenaAllocator *)externalGuestArenaIter.current != (GuestArenaAllocator *)0x0) {
          local_88 = &(((GuestArenaAllocator *)externalGuestArenaIter.current)->super_ArenaAllocator
                      ).super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                      super_ArenaData;
        }
        sVar6 = ScanArena(this,local_88,false);
        lastMarkCount = sVar6 + lastMarkCount;
      }
    }
    else {
      if ((this->hasPendingDeleteGuestArena & 1U) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                           ,0x779,"(this->hasPendingDeleteGuestArena)",
                           "this->hasPendingDeleteGuestArena");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      ArenaData::SetLockBlockList((ArenaData *)(externalGuestArenaIter.current + 1),false);
      DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::EditingIterator::
      RemoveCurrent<Memory::HeapAllocator>((EditingIterator *)&allocator,&HeapAllocator::Instance);
    }
  }
  guestArenaIter.super_Iterator.list =
       (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0;
  this->hasPendingDeleteGuestArena = false;
  DListBase<Memory::ArenaData_*,_RealCount>::Iterator::Iterator
            ((Iterator *)local_68,&this->externalGuestArenaList);
  while( true ) {
    if (externalGuestArenaIter.list == (DListBase<Memory::ArenaData_*,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    this_00 = local_68;
    node_00 = DListNodeBase<Memory::ArenaData_*>::Next
                        (&(externalGuestArenaIter.list)->super_DListNodeBase<Memory::ArenaData_*>);
    bVar2 = DListBase<Memory::ArenaData_*,_RealCount>::IsHead
                      ((DListBase<Memory::ArenaData_*,_RealCount> *)this_00,node_00);
    if (bVar2) break;
    externalGuestArenaIter.list =
         (DListBase<Memory::ArenaData_*,_RealCount> *)
         DListNodeBase<Memory::ArenaData_*>::Next
                   (&(externalGuestArenaIter.list)->super_DListNodeBase<Memory::ArenaData_*>);
    ppAVar5 = DListBase<Memory::ArenaData_*,_RealCount>::Iterator::Data((Iterator *)local_68);
    sVar6 = ScanArena(this,*ppAVar5,false);
    lastMarkCount = sVar6 + lastMarkCount;
  }
  externalGuestArenaIter.list = (DListBase<Memory::ArenaData_*,_RealCount> *)0x0;
  ScanImplicitRoots(this);
  (this->collectionStats).rootCount =
       ((this->collectionStats).markData.markCount - (long)guestArenaIter.super_Iterator.current) +
       (this->collectionStats).rootCount;
  return lastMarkCount;
}

Assistant:

size_t
Recycler::FindRoots()
{
    size_t scanRootBytes = 0;
#ifdef RECYCLER_STATS
    size_t lastMarkCount = this->collectionStats.markData.markCount;
#endif

    GCETW(GC_SCANROOTS_START, (this));

    RECYCLER_PROFILE_EXEC_BEGIN(this, Js::FindRootPhase);

    // go through ITracker* stuff. Don't need to do it if we are doing a partial collection
    // as we keep track and mark all trackable objects.
    // Do this first because the host might unpin stuff in the process
    if (externalRootMarker != NULL)
    {
#if ENABLE_PARTIAL_GC
        if (!this->inPartialCollectMode)
#endif
        {
            RECYCLER_PROFILE_EXEC_BEGIN(this, Js::FindRootExtPhase);
#if DBG_DUMP
            if (GetRecyclerFlagsTable().Trace.IsEnabled(Js::MarkPhase)
                || GetRecyclerFlagsTable().Trace.IsEnabled(Js::FindRootPhase))
            {
                this->forceTraceMark = true;
                Output::Print(_u("Scanning External Roots: "));
            }
#endif
            BEGIN_DUMP_OBJECT(this, _u("External Roots"));

            // PARTIALGC-TODO: How do we count external roots?
            externalRootMarker(externalRootMarkerContext);
            END_DUMP_OBJECT(this);
#if DBG_DUMP
            if (GetRecyclerFlagsTable().Trace.IsEnabled(Js::MarkPhase)
                || GetRecyclerFlagsTable().Trace.IsEnabled(Js::FindRootPhase))
            {
                this->forceTraceMark = false;
                Output::Print(_u("\n"));
                Output::Flush();
            }
#endif
            RECYCLER_PROFILE_EXEC_END(this, Js::FindRootExtPhase);
        }
    }

#if DBG_DUMP
    if (GetRecyclerFlagsTable().Trace.IsEnabled(Js::MarkPhase)
        || GetRecyclerFlagsTable().Trace.IsEnabled(Js::FindRootPhase))
    {
        this->forceTraceMark = true;
        Output::Print(_u("Scanning Pinned Objects: "));
    }
#endif

    scanRootBytes += this->ScanPinnedObjects</*background = */false>();

#if DBG_DUMP
    if (GetRecyclerFlagsTable().Trace.IsEnabled(Js::MarkPhase)
        || GetRecyclerFlagsTable().Trace.IsEnabled(Js::FindRootPhase))
    {
        this->forceTraceMark = false;
        Output::Print(_u("\n"));
        Output::Flush();
    }
#endif

#if ENABLE_CONCURRENT_GC
    Assert(!this->hasPendingConcurrentFindRoot);
#endif
    RECYCLER_PROFILE_EXEC_BEGIN(this, Js::FindRootArenaPhase);
    DListBase<GuestArenaAllocator>::EditingIterator guestArenaIter(&guestArenaList);
    while (guestArenaIter.Next())
    {
        GuestArenaAllocator& allocator = guestArenaIter.Data();
#if ENABLE_CONCURRENT_GC
        if (allocator.pendingDelete)
        {
            Assert(this->hasPendingDeleteGuestArena);
            allocator.SetLockBlockList(false);

            guestArenaIter.RemoveCurrent(&HeapAllocator::Instance);
        }
        else if (this->backgroundFinishMarkCount == 0)
#endif
        {
            // Only scan arena if we haven't finished mark in the background
            // (which is true if concurrent GC is disabled)
            scanRootBytes += ScanArena(&allocator, false);
        }
    }
    this->hasPendingDeleteGuestArena = false;

    DList<ArenaData *, HeapAllocator>::Iterator externalGuestArenaIter(&externalGuestArenaList);
    while (externalGuestArenaIter.Next())
    {
        scanRootBytes += ScanArena(externalGuestArenaIter.Data(), false);
    }
    RECYCLER_PROFILE_EXEC_END(this, Js::FindRootArenaPhase);

    this->ScanImplicitRoots();

    RECYCLER_PROFILE_EXEC_END(this, Js::FindRootPhase);
    GCETW(GC_SCANROOTS_STOP, (this));
    RECYCLER_STATS_ADD(this, rootCount, this->collectionStats.markData.markCount - lastMarkCount);
    return scanRootBytes;
}